

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp3::groebnerRow10_000_f
               (Matrix<double,_15,_18,_0,_15,_18> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double factor;
  Index in_stack_ffffffffffffff98;
  DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *in_stack_ffffffffffffffa0;
  DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x93cd21);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x93cd3f);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x93cd63);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x93cd8b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x93cda9);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *pSVar2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar8,auVar12);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x93cdf9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x93ce17);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *pSVar2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar9,auVar13);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x93ce67);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x93ce85);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *pSVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar10,auVar14);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x93ced5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x93cef3);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *pSVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar11,auVar15);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::groebnerRow10_000_f( Eigen::Matrix<double,15,18> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,13) / groebnerMatrix(10,13);
  groebnerMatrix(targetRow,13) = 0.0;
  groebnerMatrix(targetRow,14) -= factor * groebnerMatrix(10,14);
  groebnerMatrix(targetRow,15) -= factor * groebnerMatrix(10,15);
  groebnerMatrix(targetRow,16) -= factor * groebnerMatrix(10,16);
  groebnerMatrix(targetRow,17) -= factor * groebnerMatrix(10,17);
}